

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O1

int __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
num_keys_in_range(AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                  *this,int left,int right)

{
  uint64_t *puVar1;
  sbyte sVar2;
  int iVar3;
  long lVar4;
  byte bVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  
  if (((-1 < left) && (left <= right)) && (right <= this->data_capacity_)) {
    uVar8 = (uint)left >> 6;
    uVar7 = (uint)right >> 6;
    puVar1 = this->bitmap_;
    uVar6 = -1L << ((ulong)(uint)left & 0x3f);
    if (uVar8 == uVar7) {
      bVar5 = (byte)right & 0x3f;
      sVar2 = (bVar5 < 0x41) * ('@' - bVar5);
      iVar3 = (int)POPCOUNT((uVar6 << sVar2) >> sVar2 & puVar1[uVar8]);
    }
    else {
      lVar4 = POPCOUNT(puVar1[uVar8] & uVar6);
      iVar3 = (int)lVar4;
      uVar6 = (ulong)(uVar8 + 1);
      if (uVar8 + 1 < uVar7) {
        do {
          lVar4 = (long)(int)lVar4 + POPCOUNT(puVar1[uVar6]);
          iVar3 = (int)lVar4;
          uVar6 = uVar6 + 1;
        } while (uVar7 != uVar6);
      }
      if (uVar7 != this->bitmap_size_) {
        bVar5 = (byte)right & 0x3f;
        sVar2 = (bVar5 < 0x41) * ('@' - bVar5);
        iVar3 = iVar3 + (int)POPCOUNT((puVar1[uVar7] << sVar2) >> sVar2);
      }
    }
    return iVar3;
  }
  __assert_fail("left >= 0 && left <= right && right <= data_capacity_",
                "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex_nodes.h"
                ,0x21c,
                "int alex::AlexDataNode<int, int, alex::AlexCompare, std::allocator<std::pair<int, int>>, false>::num_keys_in_range(int, int) const [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = false]"
               );
}

Assistant:

int num_keys_in_range(int left, int right) const {
    assert(left >= 0 && left <= right && right <= data_capacity_);
    int num_keys = 0;
    int left_bitmap_idx = left >> 6;
    int right_bitmap_idx = right >> 6;
    if (left_bitmap_idx == right_bitmap_idx) {
      uint64_t bitmap_data = bitmap_[left_bitmap_idx];
      int left_bit_pos = left - (left_bitmap_idx << 6);
      bitmap_data &= ~((1ULL << left_bit_pos) - 1);
      int right_bit_pos = right - (right_bitmap_idx << 6);
      bitmap_data &= ((1ULL << right_bit_pos) - 1);
      num_keys += _mm_popcnt_u64(bitmap_data);
    } else {
      uint64_t left_bitmap_data = bitmap_[left_bitmap_idx];
      int bit_pos = left - (left_bitmap_idx << 6);
      left_bitmap_data &= ~((1ULL << bit_pos) - 1);
      num_keys += _mm_popcnt_u64(left_bitmap_data);
      for (int i = left_bitmap_idx + 1; i < right_bitmap_idx; i++) {
        num_keys += _mm_popcnt_u64(bitmap_[i]);
      }
      if (right_bitmap_idx != bitmap_size_) {
        uint64_t right_bitmap_data = bitmap_[right_bitmap_idx];
        bit_pos = right - (right_bitmap_idx << 6);
        right_bitmap_data &= ((1ULL << bit_pos) - 1);
        num_keys += _mm_popcnt_u64(right_bitmap_data);
      }
    }
    return num_keys;
  }